

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O0

SRes Lzma2Dec_Allocate(CLzma2Dec *p,Byte prop,ISzAlloc *alloc)

{
  SRes SVar1;
  Byte in_SIL;
  ISzAlloc *in_RDI;
  Byte *unaff_retaddr;
  CLzmaDec *in_stack_00000008;
  int __result__;
  Byte props [5];
  Byte local_25 [21];
  uint in_stack_fffffffffffffffc;
  
  SVar1 = Lzma2Dec_GetOldProps(in_SIL,local_25);
  if (SVar1 == 0) {
    SVar1 = LzmaDec_Allocate(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
  }
  return SVar1;
}

Assistant:

SRes Lzma2Dec_Allocate(CLzma2Dec *p, Byte prop, ISzAlloc *alloc)
{
  Byte props[LZMA_PROPS_SIZE];
  RINOK(Lzma2Dec_GetOldProps(prop, props));
  return LzmaDec_Allocate(&p->decoder, props, LZMA_PROPS_SIZE, alloc);
}